

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<short>::test_many<(libdivide::Branching)1>(DivideTest<short> *this,short denom)

{
  short sVar1;
  ushort uVar2;
  short sVar3;
  byte bVar4;
  divider<short,_(libdivide::Branching)1> the_divider;
  string_class local_48;
  
  if (denom == 0) {
    fprintf(_stderr,"libdivide.h:%d: %s(): Error: %s\n",0x4fb,"libdivide_internal_s16_gen",
            "divider must be != 0");
    abort();
  }
  uVar2 = -denom;
  if (0 < denom) {
    uVar2 = denom;
  }
  bVar4 = (byte)(LZCOUNT(uVar2) ^ 0xfU);
  if ((uVar2 - 1 & uVar2) == 0) {
    the_divider.div.denom.more = bVar4 | (byte)((ushort)denom >> 8) & 0x80;
    the_divider.div.denom.magic = 0;
  }
  else {
    sVar1 = (short)((uint)(0x8000 << (LZCOUNT(uVar2) ^ 0xfU)) / (uint)uVar2);
    sVar3 = uVar2 * sVar1;
    the_divider.div.denom.more = ((-1 < denom) << 7 | bVar4) - 0x40;
    the_divider.div.denom.magic = (0 < sVar3 || uVar2 <= (ushort)(sVar3 * -2)) + 1 + sVar1 * 2;
  }
  sVar3 = libdivide::divider<short,_(libdivide::Branching)1>::recover(&the_divider);
  if (sVar3 == denom) {
    test_edgecase_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_small_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_pow2_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_allbits_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_random_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    test_vectordivide_numerators<(libdivide::Branching)1>(this,denom,&the_divider);
    return;
  }
  std::operator<<((ostream *)&std::cerr,"Failed to recover divisor for ");
  testcase_name_abi_cxx11_(&local_48,this,1);
  std::operator<<((ostream *)&std::cerr,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  std::operator<<((ostream *)&std::cerr,": ");
  std::ostream::operator<<((ostream *)&std::cerr,denom);
  std::operator<<((ostream *)&std::cerr,", but got ");
  std::ostream::operator<<((ostream *)&std::cerr,sVar3);
  std::operator<<((ostream *)&std::cerr,"\n");
  exit(1);
}

Assistant:

void test_many(T denom) {
        // Don't try dividing by 1 with unsigned branchfree
        if (ALGO == BRANCHFREE && !std::numeric_limits<T>::is_signed && denom == 1) {
            return;
        }

        const divider<T, ALGO> the_divider = divider<T, ALGO>(denom);
        T recovered = the_divider.recover();
        if (recovered != denom) {
            PRINT_ERROR(F("Failed to recover divisor for "));
            PRINT_ERROR(testcase_name(ALGO));
            PRINT_ERROR(F(": "));
            PRINT_ERROR(denom);
            PRINT_ERROR(F(", but got "));
            PRINT_ERROR(recovered);
            PRINT_ERROR(F("\n"));
            TEST_FAIL();
        }

        test_edgecase_numerators(denom, the_divider);
        test_small_numerators(denom, the_divider);
        test_pow2_numerators(denom, the_divider);
        test_allbits_numerators(denom, the_divider);
#if !defined(__AVR__)
        test_random_numerators(denom, the_divider);
        test_vectordivide_numerators(denom, the_divider);
#endif
    }